

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmain.c
# Opt level: O2

filepos_t EBML_ReadCodedSizeValue(uint8_t *InBuffer,size_t *BufferSize,filepos_t *SizeUnknown)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  uint8_t PossibleSize [8];
  
  *SizeUnknown = 0x7f;
  uVar4 = 0x7f;
  sVar3 = 0;
  for (uVar2 = 0; uVar2 < 8; uVar2 = uVar2 + 1) {
    uVar1 = 0;
    if (*BufferSize <= uVar2) goto LAB_00110232;
    if ((char)(*InBuffer << ((byte)uVar2 & 0x1f)) < '\0') {
      for (uVar4 = 0xffffffffffffffff; uVar2 != uVar4; uVar4 = uVar4 + 1) {
        PossibleSize[uVar4 + 1] = InBuffer[uVar4 + 1];
      }
      uVar1 = (ulong)(-0x81 >> ((byte)uVar2 & 0x1f) & (uint)PossibleSize[0]);
      for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
        uVar1 = uVar1 << 8 | (ulong)PossibleSize[uVar4 + 1];
      }
      sVar3 = uVar2 + 1;
      goto LAB_00110232;
    }
    uVar4 = uVar4 << 7 | 0xff;
    *SizeUnknown = uVar4;
  }
  uVar1 = 0;
LAB_00110232:
  *BufferSize = sVar3;
  return uVar1;
}

Assistant:

filepos_t EBML_ReadCodedSizeValue(const uint8_t *InBuffer, size_t *BufferSize, filepos_t *SizeUnknown)
{
    uint8_t SizeBitMask = 1 << 7;
    filepos_t Result = 0x7F;
    unsigned int SizeIdx, PossibleSizeLength = 0;
    uint8_t PossibleSize[8];
    unsigned int i;

    *SizeUnknown = 0x7F; // the last bit is discarded when computing the size
    for (SizeIdx = 0; SizeIdx < *BufferSize && SizeIdx < 8; SizeIdx++) {
        if (InBuffer[0] & (SizeBitMask >> SizeIdx)) {
            // ID found
            PossibleSizeLength = SizeIdx + 1;
            SizeBitMask >>= SizeIdx;
            for (SizeIdx = 0; SizeIdx < PossibleSizeLength; SizeIdx++) {
                PossibleSize[SizeIdx] = InBuffer[SizeIdx];
            }
            for (SizeIdx = 0; SizeIdx < PossibleSizeLength - 1; SizeIdx++) {
                Result <<= 7;
                Result |= 0xFF;
            }

            Result = 0;
            Result |= PossibleSize[0] & ~SizeBitMask;
            for (i = 1; i<PossibleSizeLength; i++) {
                Result <<= 8;
                Result |= PossibleSize[i];
            }

            *BufferSize = PossibleSizeLength;

            return Result;
        }
        *SizeUnknown <<= 7;
        *SizeUnknown |= 0xFF;
    }

    *BufferSize = 0;
    return 0;
}